

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O2

void __thiscall HFactor::updateCFT(HFactor *this,HVector *aq,HVector *ep,HighsInt *iRow)

{
  vector<double,_std::allocator<double>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  int *piVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  vector<int,_std::allocator<int>_> *this_02;
  int iVar7;
  HVector *vec;
  HVectorBase<double> *pHVar8;
  ulong uVar9;
  undefined4 *puVar10;
  void *pvVar11;
  pointer piVar12;
  pointer pdVar13;
  pointer piVar14;
  long lVar15;
  size_t sVar16;
  pointer piVar17;
  HighsInt pp;
  vector<double,_std::allocator<double>_> *pvVar18;
  size_type __new_size;
  int iVar19;
  HFactor *pHVar20;
  pointer piVar21;
  vector<int,_std::allocator<int>_> *pvVar22;
  vector<double,_std::allocator<double>_> *pvVar23;
  int iVar24;
  ulong uVar25;
  HighsInt isort;
  uint uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  bool bVar31;
  double dVar32;
  HighsInt index;
  int iStack_16c;
  HighsInt index_1;
  vector<double,_std::allocator<double>_> *local_160;
  double local_158;
  undefined8 uStack_150;
  vector<int,_std::allocator<int>_> *local_148;
  HighsInt *local_140;
  HFactor *local_138;
  ulong local_130;
  vector<int,_std::allocator<int>_> *local_128;
  undefined4 *local_120;
  HighsInt u_endX;
  ulong local_110;
  ulong local_108;
  void *local_100;
  void *local_f8;
  vector<int,_std::allocator<int>_> *local_f0;
  void *local_e8;
  void *local_e0;
  vector<int,_std::allocator<int>_> *local_d8;
  undefined8 uStack_d0;
  vector<int,_std::allocator<int>_> *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  vector<int,_std::allocator<int>_> *local_b0;
  ulong local_a8;
  void *local_a0;
  void *local_98;
  vector<double,_std::allocator<double>_> *local_90;
  vector<double,_std::allocator<double>_> *local_88;
  int local_7c;
  double local_78;
  ulong uStack_70;
  vector<int,_std::allocator<int>_> *local_60;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> sorted_pp;
  
  uVar30 = 4;
  uVar25 = 0;
  local_130 = 0;
  for (pHVar8 = aq; pHVar8 != (HVector *)0x0; pHVar8 = pHVar8->next) {
    local_130 = local_130 + 1;
    uVar30 = uVar30 + 4;
    uVar25 = uVar25 + 8;
  }
  local_140 = iRow;
  local_138 = this;
  local_f8 = operator_new__(uVar25);
  local_e0 = operator_new__(uVar25);
  pHVar20 = local_138;
  for (uVar9 = 0; local_130 != uVar9; uVar9 = uVar9 + 1) {
    *(HVector **)((long)local_f8 + uVar9 * 8) = aq;
    *(HVector **)((long)local_e0 + uVar9 * 8) = ep;
    aq = aq->next;
    ep = ep->next;
  }
  local_b8 = &local_138->pf_pivot_index;
  piVar21 = (local_138->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish;
  piVar17 = (local_138->pf_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_100 = operator_new__(uVar30 - 4);
  local_e8 = operator_new__(uVar25);
  local_a0 = operator_new__(uVar25);
  piVar3 = (pHVar20->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar13 = (pHVar20->u_pivot_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  this_00 = &pHVar20->u_pivot_value;
  lVar15 = 0;
  uVar9 = local_130;
  while (bVar31 = uVar9 != 0, uVar9 = uVar9 - 1, bVar31) {
    iVar7 = local_140[lVar15];
    iVar24 = piVar3[iVar7];
    *(int *)((long)local_100 + lVar15 * 4) = iVar24;
    *(double *)((long)local_e8 + lVar15 * 8) = pdVar13[iVar24];
    *(undefined8 *)((long)local_a0 + lVar15 * 8) =
         *(undefined8 *)(*(long *)(*(long *)((long)local_f8 + lVar15 * 8) + 0x20) + (long)iVar7 * 8)
    ;
    lVar15 = lVar15 + 1;
  }
  puVar10 = (undefined4 *)operator_new__(uVar30);
  pvVar11 = operator_new__(uVar25);
  local_60 = &pHVar20->u_index;
  local_110 = (ulong)((long)(pHVar20->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(pHVar20->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2;
  *puVar10 = (int)local_110;
  sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  sorted_pp.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = &pHVar20->iwork;
  local_c0 = &pHVar20->pf_start;
  local_b0 = &pHVar20->pf_index;
  local_88 = &pHVar20->pf_value;
  local_90 = &pHVar20->u_value;
  local_a8 = (ulong)(int)((ulong)((long)piVar21 - (long)piVar17) >> 2);
  local_160 = (vector<double,_std::allocator<double>_> *)0x0;
  local_120 = puVar10;
  local_98 = pvVar11;
  while ((vector<double,_std::allocator<double>_> *)local_130 != local_160) {
    piVar21 = (pHVar20->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((pHVar20->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar21) {
      (pHVar20->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = piVar21;
    }
    lVar15 = *(long *)((long)local_f8 + (long)local_160 * 8);
    for (lVar27 = 0; uVar30 = local_a8, lVar27 < *(int *)(lVar15 + 0x7c); lVar27 = lVar27 + 1) {
      index = *(int *)(*(long *)(lVar15 + 0x80) + lVar27 * 4);
      local_158 = *(double *)(*(long *)(lVar15 + 0x98) + lVar27 * 8);
      std::vector<int,_std::allocator<int>_>::push_back(this_01,(value_type_conflict2 *)&index);
      (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[index] = local_158;
    }
    for (uVar25 = 0; pvVar18 = local_90,
        (vector<double,_std::allocator<double>_> *)uVar25 != local_160; uVar25 = uVar25 + 1) {
      index = local_140[uVar25];
      pdVar13 = (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_158 = pdVar13[local_140[uVar25]];
      piVar21 = (pHVar20->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar15 = (long)piVar21[uVar25 + uVar30]; lVar15 < piVar21[uVar25 + uVar30 + 1];
          lVar15 = lVar15 + 1) {
        local_158 = local_158 -
                    pdVar13[(pHVar20->pf_index).super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start[lVar15]] *
                    (pHVar20->pf_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar15];
      }
      std::vector<int,_std::allocator<int>_>::push_back(this_01,(value_type_conflict2 *)&index);
      (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[index] = local_158;
    }
    local_148 = (vector<int,_std::allocator<int>_> *)(local_140 + (long)local_160);
    pdVar13 = (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_128 = (vector<int,_std::allocator<int>_> *)pdVar13[*(int *)local_148];
    pdVar13[*(int *)local_148] = 0.0;
    local_f0 = (vector<int,_std::allocator<int>_> *)(long)(int)local_120[(long)local_160];
    uVar26 = 0;
    while( true ) {
      piVar21 = (pHVar20->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar17 = (pHVar20->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)((long)piVar17 - (long)piVar21 >> 2) <= (ulong)uVar26) break;
      index_1 = piVar21[uVar26];
      pdVar13 = (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      _index = *(pair<int,_int> *)(pdVar13 + index_1);
      pdVar13[index_1] = 0.0;
      if (1e-14 < ABS((double)_index)) {
        std::vector<int,_std::allocator<int>_>::push_back(local_60,&index_1);
        std::vector<double,_std::allocator<double>_>::push_back
                  (pvVar18,(value_type_conflict1 *)&index);
      }
      uVar26 = uVar26 + 1;
    }
    local_108 = (ulong)((long)(pHVar20->u_index).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)(pHVar20->u_index).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 2;
    local_120[(long)local_160 + 1] = (int)local_108;
    local_78 = *(double *)((long)local_e8 + (long)local_160 * 8);
    uStack_70 = 0;
    *(double *)((long)pvVar11 + (long)local_160 * 8) =
         *(double *)((long)local_a0 + (long)local_160 * 8) * local_78;
    if (piVar17 != piVar21) {
      (pHVar20->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = piVar21;
    }
    lVar15 = *(long *)((long)local_e0 + (long)local_160 * 8);
    for (lVar27 = 0; lVar27 < *(int *)(lVar15 + 0x7c); lVar27 = lVar27 + 1) {
      index = *(int *)(*(long *)(lVar15 + 0x80) + lVar27 * 4);
      local_158 = *(double *)(*(long *)(lVar15 + 0x98) + lVar27 * 8);
      std::vector<int,_std::allocator<int>_>::push_back(this_01,(value_type_conflict2 *)&index);
      (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[index] = local_158;
    }
    pvVar18 = local_160;
    for (uVar30 = 0; pvVar11 = local_98,
        (vector<double,_std::allocator<double>_> *)uVar30 != pvVar18; uVar30 = uVar30 + 1) {
      lVar15 = (long)sorted_pp.
                     super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar30].second;
      iVar7 = local_140[lVar15];
      pdVar13 = (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (1e-14 < ABS(pdVar13[iVar7])) {
        local_d8 = (vector<int,_std::allocator<int>_> *)
                   (pdVar13[iVar7] * -*(double *)((long)local_e8 + lVar15 * 8));
        lVar15 = *(long *)((long)local_e0 + lVar15 * 8);
        uStack_d0 = 0;
        for (lVar27 = 0; lVar27 < *(int *)(lVar15 + 0x7c); lVar27 = lVar27 + 1) {
          index = *(int *)(*(long *)(lVar15 + 0x80) + lVar27 * 4);
          local_158 = *(double *)(*(long *)(lVar15 + 0x98) + lVar27 * 8);
          std::vector<int,_std::allocator<int>_>::push_back(this_01,(value_type_conflict2 *)&index);
          pdVar13 = (local_138->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar13[index] = local_158 * (double)local_d8 + pdVar13[index];
        }
        pdVar13 = (local_138->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pvVar18 = local_160;
        pHVar20 = local_138;
      }
      pdVar13[iVar7] = 0.0;
    }
    uVar30 = 0;
    while (this_02 = local_b0, (vector<double,_std::allocator<double>_> *)uVar30 != pvVar18) {
      index = local_140[uVar30];
      pdVar13 = (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_158 = pdVar13[local_140[uVar30]];
      for (lVar15 = (long)(int)local_120[uVar30]; lVar15 < (int)local_120[uVar30 + 1];
          lVar15 = lVar15 + 1) {
        local_158 = local_158 -
                    pdVar13[(pHVar20->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl
                            .super__Vector_impl_data._M_start[lVar15]] *
                    (pHVar20->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar15];
      }
      local_d8 = *(vector<int,_std::allocator<int>_> **)((long)pvVar11 + uVar30 * 8);
      std::vector<int,_std::allocator<int>_>::push_back(this_01,(value_type_conflict2 *)&index);
      (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[index] = local_158 / (double)local_d8;
      uVar30 = uVar30 + 1;
    }
    pdVar13 = (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar32 = 0.0;
    for (pvVar22 = local_f0; (long)pvVar22 < (long)(int)local_108;
        pvVar22 = (vector<int,_std::allocator<int>_> *)((long)pvVar22 + 1)) {
      dVar32 = dVar32 + pdVar13[(pHVar20->u_index).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start[(long)pvVar22]] *
                        (pHVar20->u_value).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[(long)pvVar22];
    }
    *(double *)((long)pvVar11 + (long)pvVar18 * 8) = dVar32 * local_78 + (double)local_128;
    pdVar13[*(int *)local_148] = 0.0;
    local_78 = -local_78;
    uStack_70 = uStack_70 ^ 0x8000000000000000;
    uVar26 = 0;
    while( true ) {
      piVar21 = (pHVar20->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((ulong)((long)(pHVar20->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar21 >> 2) <= (ulong)uVar26)
      break;
      index_1 = piVar21[uVar26];
      pdVar13 = (pHVar20->dwork).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_158 = pdVar13[index_1];
      pdVar13[index_1] = 0.0;
      uStack_150 = 0;
      if (1e-14 < ABS(local_158)) {
        std::vector<int,_std::allocator<int>_>::push_back(this_02,&index_1);
        _index = (pair<int,_int>)(local_158 * local_78);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (local_88,(double *)&index);
      }
      uVar26 = uVar26 + 1;
    }
    std::vector<int,_std::allocator<int>_>::push_back(local_b8,(value_type_conflict2 *)local_148);
    pvVar18 = local_160;
    iVar7 = (int)((ulong)((long)(pHVar20->pf_index).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(pHVar20->pf_index).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2);
    pHVar20->u_total_x =
         (pHVar20->u_total_x -
         (pHVar20->pf_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish[-1]) + iVar7;
    index = iVar7;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_c0,(int *)&index);
    _index = (pair<int,_int>)
             ((long)pvVar18 << 0x20 | (ulong)*(uint *)((long)local_100 + (long)pvVar18 * 4));
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
    emplace_back<std::pair<int,int>>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&sorted_pp,
               (pair<int,_int> *)&index);
    pdqsort<__gnu_cxx::__normal_iterator<std::pair<int,int>*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>,std::less<std::pair<int,int>>>
              (sorted_pp.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               sorted_pp.
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    local_160 = (vector<double,_std::allocator<double>_> *)((long)pvVar18 + 1);
  }
  local_128 = &pHVar20->ur_lastp;
  local_148 = &pHVar20->ur_start;
  local_d8 = &pHVar20->ur_index;
  local_b0 = &pHVar20->u_start;
  local_b8 = &pHVar20->u_last_p;
  local_f0 = &pHVar20->ur_space;
  local_160 = &pHVar20->ur_value;
  local_c0 = &pHVar20->u_pivot_index;
  uVar30 = 0;
  do {
    if (local_130 == uVar30) {
      operator_delete__(local_f8);
      operator_delete__(local_e0);
      operator_delete__(local_100);
      operator_delete__(local_e8);
      operator_delete__(local_a0);
      operator_delete__(local_120);
      operator_delete__(pvVar11);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&sorted_pp.
                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>);
      return;
    }
    iVar7 = local_140[uVar30];
    index = iVar7;
    local_158 = (double)(long)*(int *)((long)local_100 + uVar30 * 4);
    piVar14 = (pHVar20->ur_lastp).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar12 = (pHVar20->ur_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    pHVar20->u_total_x = pHVar20->u_total_x + (piVar12[(long)local_158] - piVar14[(long)local_158]);
    piVar21 = (pHVar20->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar17 = (pHVar20->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar3 = (pHVar20->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (pHVar20->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (pHVar20->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar13 = (pHVar20->u_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar15 = (long)piVar12[(long)local_158]; lVar15 < piVar14[(long)local_158];
        lVar15 = lVar15 + 1) {
      iVar24 = piVar17[piVar21[lVar15]];
      iVar2 = piVar3[iVar24];
      lVar28 = (long)iVar2;
      iVar19 = piVar4[iVar24];
      lVar27 = (long)iVar19;
      piVar4[iVar24] = iVar19 + -1;
      if (iVar19 < iVar2) {
        iVar19 = iVar2;
      }
      for (; lVar28 < lVar27; lVar28 = lVar28 + 1) {
        if ((local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar28] == iVar7) {
          iVar19 = (int)lVar28;
          break;
        }
      }
      piVar5[iVar19] = piVar5[lVar27 + -1];
      pdVar13[iVar19] = pdVar13[lVar27 + -1];
      pHVar20 = local_138;
    }
    piVar21 = (pHVar20->u_last_p).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar17 = (pHVar20->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar3 = (pHVar20->u_start).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pHVar20->u_total_x = pHVar20->u_total_x + (piVar3[(long)local_158] - piVar21[(long)local_158]);
    piVar4 = (pHVar20->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (pHVar20->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar6 = (pHVar20->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar13 = (pHVar20->ur_value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (lVar15 = (long)piVar3[(long)local_158]; lVar15 < piVar21[(long)local_158];
        lVar15 = lVar15 + 1) {
      iVar24 = piVar17[piVar4[lVar15]];
      iVar2 = piVar12[iVar24];
      lVar28 = (long)iVar2;
      iVar19 = piVar14[iVar24];
      lVar27 = (long)iVar19;
      piVar14[iVar24] = iVar19 + -1;
      if (iVar19 < iVar2) {
        iVar19 = iVar2;
      }
      for (; lVar28 < lVar27; lVar28 = lVar28 + 1) {
        if ((local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[lVar28] == iVar7) {
          iVar19 = (int)lVar28;
          break;
        }
      }
      piVar1 = piVar5 + iVar24;
      *piVar1 = *piVar1 + 1;
      piVar6[iVar19] = piVar6[lVar27 + -1];
      pdVar13[iVar19] = pdVar13[lVar27 + -1];
      pHVar20 = local_138;
    }
    index_1 = (HighsInt)local_110;
    u_endX = local_120[uVar30 + 1];
    pHVar20->u_total_x = pHVar20->u_total_x + (u_endX - index_1);
    local_a8 = uVar30 + 1;
    local_110 = CONCAT44(local_110._4_4_,u_endX);
    pvVar18 = local_90;
    local_108 = uVar30;
    for (pvVar23 = (vector<double,_std::allocator<double>_> *)(long)index_1; dVar32 = local_158,
        (long)pvVar23 < (long)u_endX;
        pvVar23 = (vector<double,_std::allocator<double>_> *)
                  ((long)&(pvVar23->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start + 1)) {
      iVar7 = (pHVar20->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [(pHVar20->u_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[(long)pvVar23]];
      piVar21 = (pHVar20->ur_space).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar24 = piVar21[iVar7];
      piVar17 = (pHVar20->ur_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (iVar24 == 0) {
        local_78 = (double)(long)piVar12[iVar7];
        iVar2 = piVar14[iVar7];
        iVar29 = iVar2 - piVar12[iVar7];
        iVar24 = (int)((double)iVar29 * 1.1 + 5.0);
        iVar19 = (int)((ulong)((long)(pHVar20->ur_index).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish - (long)piVar17) >> 2);
        __new_size = (size_type)(iVar19 + iVar24);
        local_88 = pvVar23;
        std::vector<int,_std::allocator<int>_>::resize(local_d8,__new_size);
        std::vector<double,_std::allocator<double>_>::resize(local_160,__new_size);
        sVar16 = (long)iVar2 * 4 + (long)local_78 * -4;
        if (sVar16 != 0) {
          piVar21 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          memmove(piVar21 + iVar19,piVar21 + (long)local_78,sVar16);
        }
        sVar16 = (long)iVar2 * 8 + (long)local_78 * -8;
        if (sVar16 != 0) {
          pdVar13 = (local_160->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          memmove(pdVar13 + iVar19,pdVar13 + (long)local_78,sVar16);
        }
        piVar12 = (local_148->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar12[iVar7] = iVar19;
        piVar14 = (local_128->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar14[iVar7] = iVar29 + iVar19;
        iVar24 = iVar24 - iVar29;
        piVar21 = (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        piVar21[iVar7] = iVar24;
        piVar17 = (local_d8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        pHVar20 = local_138;
        pvVar18 = local_90;
        pvVar23 = local_88;
      }
      piVar21[iVar7] = iVar24 + -1;
      iVar24 = piVar14[iVar7];
      piVar14[iVar7] = iVar24 + 1;
      piVar17[iVar24] = index;
      (local_160->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start[iVar24] =
           (pvVar18->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[(long)pvVar23];
    }
    std::vector<int,_std::allocator<int>_>::push_back(local_b0,&index_1);
    std::vector<int,_std::allocator<int>_>::push_back(local_b8,&u_endX);
    std::vector<int,_std::allocator<int>_>::push_back
              (local_148,
               (local_148->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start + (long)dVar32);
    std::vector<int,_std::allocator<int>_>::push_back
              (local_128,
               (local_148->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start + (long)dVar32);
    local_7c = ((local_128->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[(long)dVar32] +
               (local_f0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)dVar32]) -
               (local_148->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)dVar32];
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_f0,&local_7c);
    piVar21 = (pHVar20->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    (pHVar20->u_pivot_lookup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start[index] =
         (int)((ulong)((long)(pHVar20->u_pivot_index).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar21) >> 2);
    piVar21[(long)dVar32] = -1;
    std::vector<int,_std::allocator<int>_>::push_back(local_c0,&index);
    std::vector<double,_std::allocator<double>_>::push_back
              (this_00,(value_type_conflict1 *)((long)local_98 + local_108 * 8));
    local_110 = local_110 & 0xffffffff;
    uVar30 = local_a8;
    pvVar11 = local_98;
  } while( true );
}

Assistant:

void HFactor::updateCFT(HVector* aq, HVector* ep, HighsInt* iRow
                        //, HighsInt* hint
) {
  /*
   * In the major update loop, the prefix
   *
   * c(p) = current working pivot
   * p(p) = previous pivot  (0 =< pp < cp)
   */

  HighsInt num_update = 0;
  for (HVector* vec = aq; vec != 0; vec = vec->next) num_update++;

  HVector** aq_work = new HVector*[num_update];
  HVector** ep_work = new HVector*[num_update];

  for (HighsInt i = 0; i < num_update; i++) {
    aq_work[i] = aq;
    ep_work[i] = ep;
    aq = aq->next;
    ep = ep->next;
  }

  // Pivot related buffers
  HighsInt pf_np0 = pf_pivot_index.size();
  HighsInt* p_logic = new HighsInt[num_update];
  double* p_value = new double[num_update];
  double* p_alpha = new double[num_update];
  for (HighsInt cp = 0; cp < num_update; cp++) {
    HighsInt c_row = iRow[cp];
    HighsInt i_logic = u_pivot_lookup[c_row];
    p_logic[cp] = i_logic;
    p_value[cp] = u_pivot_value[i_logic];
    p_alpha[cp] = aq_work[cp]->array[c_row];
  }

  // Temporary U pointers
  HighsInt* t_start = new HighsInt[num_update + 1];
  double* t_pivot = new double[num_update];
  t_start[0] = u_index.size();

  // Logically sorted previous row_ep
  vector<pair<HighsInt, int> > sorted_pp;

  // Major update loop
  for (HighsInt cp = 0; cp < num_update; cp++) {
    // 1. Expand partial FTRAN result to buffer
    iwork.clear();
    for (HighsInt i = 0; i < aq_work[cp]->packCount; i++) {
      HighsInt index = aq_work[cp]->packIndex[i];
      double value = aq_work[cp]->packValue[i];
      iwork.push_back(index);
      dwork[index] = value;
    }

    // 2. Update partial FTRAN result by recent FT matrix
    for (HighsInt pp = 0; pp < cp; pp++) {
      HighsInt p_row = iRow[pp];
      double value = dwork[p_row];
      HighsInt pf_pp = pp + pf_np0;
      for (HighsInt i = pf_start[pf_pp]; i < pf_start[pf_pp + 1]; i++)
        value -= dwork[pf_index[i]] * pf_value[i];
      iwork.push_back(p_row);  // OK to duplicate
      dwork[p_row] = value;
    }

    // 3. Store the partial FTRAN result to matrix U
    double ppaq = dwork[iRow[cp]];  // pivot of the partial aq
    dwork[iRow[cp]] = 0;
    HighsInt u_countX = t_start[cp];
    HighsInt u_startX = u_countX;
    for (unsigned i = 0; i < iwork.size(); i++) {
      HighsInt index = iwork[i];
      double value = dwork[index];
      dwork[index] = 0;  // This effectively removes all duplication
      if (fabs(value) > kHighsTiny) {
        u_index.push_back(index);
        u_value.push_back(value);
      }
    }
    u_countX = u_index.size();
    t_start[cp + 1] = u_countX;
    t_pivot[cp] = p_value[cp] * p_alpha[cp];

    // 4. Expand partial BTRAN result to buffer
    iwork.clear();
    for (HighsInt i = 0; i < ep_work[cp]->packCount; i++) {
      HighsInt index = ep_work[cp]->packIndex[i];
      double value = ep_work[cp]->packValue[i];
      iwork.push_back(index);
      dwork[index] = value;
    }

    // 5. Delete logical later rows (in logical order)
    for (HighsInt isort = 0; isort < cp; isort++) {
      HighsInt pp = sorted_pp[isort].second;
      HighsInt p_row = iRow[pp];
      double multiplier = -p_value[pp] * dwork[p_row];
      if (fabs(dwork[p_row]) > kHighsTiny) {
        for (HighsInt i = 0; i < ep_work[pp]->packCount; i++) {
          HighsInt index = ep_work[pp]->packIndex[i];
          double value = ep_work[pp]->packValue[i];
          iwork.push_back(index);
          dwork[index] += value * multiplier;
        }
      }
      dwork[p_row] = 0;  // Force to be 0
    }

    // 6. Update partial BTRAN result by recent U columns
    for (HighsInt pp = 0; pp < cp; pp++) {
      HighsInt kpivot = iRow[pp];
      double value = dwork[kpivot];
      for (HighsInt k = t_start[pp]; k < t_start[pp + 1]; k++)
        value -= dwork[u_index[k]] * u_value[k];
      value /= t_pivot[pp];
      iwork.push_back(kpivot);
      dwork[kpivot] = value;  // Again OK to duplicate
    }

    // 6.x compute current alpha
    double thex = 0;
    for (HighsInt k = u_startX; k < u_countX; k++) {
      HighsInt index = u_index[k];
      double value = u_value[k];
      thex += dwork[index] * value;
    }
    t_pivot[cp] = ppaq + thex * p_value[cp];

    // 7. Store BTRAN result to FT elimination, update logic helper
    dwork[iRow[cp]] = 0;
    double pivot_multiplier = -p_value[cp];
    for (unsigned i = 0; i < iwork.size(); i++) {
      HighsInt index = iwork[i];
      double value = dwork[index];
      dwork[index] = 0;
      if (fabs(value) > kHighsTiny) {
        pf_index.push_back(index);
        pf_value.push_back(value * pivot_multiplier);
      }
    }
    pf_pivot_index.push_back(iRow[cp]);
    u_total_x += pf_index.size() - pf_start.back();
    pf_start.push_back(pf_index.size());

    // 8. Update the sorted ep
    sorted_pp.push_back(make_pair(p_logic[cp], cp));
    pdqsort(sorted_pp.begin(), sorted_pp.end());
  }

  // Now modify the U matrix
  for (HighsInt cp = 0; cp < num_update; cp++) {
    // 1. Delete pivotal row from U
    HighsInt cIndex = iRow[cp];
    HighsInt cLogic = p_logic[cp];
    u_total_x -= ur_lastp[cLogic] - ur_start[cLogic];
    for (HighsInt k = ur_start[cLogic]; k < ur_lastp[cLogic]; k++) {
      // Find the pivotal position
      HighsInt i_logic = u_pivot_lookup[ur_index[k]];
      HighsInt i_find = u_start[i_logic];
      HighsInt i_last = --u_last_p[i_logic];
      for (; i_find <= i_last; i_find++)
        if (u_index[i_find] == cIndex) break;
      // Put last to find, and delete last
      u_index[i_find] = u_index[i_last];
      u_value[i_find] = u_value[i_last];
    }

    // 2. Delete pivotal column from UR
    u_total_x -= u_last_p[cLogic] - u_start[cLogic];
    for (HighsInt k = u_start[cLogic]; k < u_last_p[cLogic]; k++) {
      // Find the pivotal position
      HighsInt i_logic = u_pivot_lookup[u_index[k]];
      HighsInt i_find = ur_start[i_logic];
      HighsInt i_last = --ur_lastp[i_logic];
      for (; i_find <= i_last; i_find++)
        if (ur_index[i_find] == cIndex) break;
      // Put last to find, and delete last
      ur_space[i_logic]++;
      ur_index[i_find] = ur_index[i_last];
      ur_value[i_find] = ur_value[i_last];
    }

    // 3. Insert the (stored) partial FTRAN to the row matrix
    HighsInt u_startX = t_start[cp];
    HighsInt u_endX = t_start[cp + 1];
    u_total_x += u_endX - u_startX;
    // Store column as UR elements
    for (HighsInt k = u_startX; k < u_endX; k++) {
      // Which ETA file
      HighsInt i_logic = u_pivot_lookup[u_index[k]];

      // Move row to the end if necessary
      if (ur_space[i_logic] == 0) {
        // Make pointers
        HighsInt row_start = ur_start[i_logic];
        HighsInt row_count = ur_lastp[i_logic] - row_start;
        HighsInt new_start = ur_index.size();
        HighsInt new_space = row_count * 1.1 + 5;

        // Check matrix UR
        ur_index.resize(new_start + new_space);
        ur_value.resize(new_start + new_space);

        // Move elements
        HighsInt i_from = row_start;
        HighsInt i_end = row_start + row_count;
        HighsInt i_to = new_start;
        copy(&ur_index[i_from], &ur_index[i_end], &ur_index[i_to]);
        copy(&ur_value[i_from], &ur_value[i_end], &ur_value[i_to]);

        // Save new pointers
        ur_start[i_logic] = new_start;
        ur_lastp[i_logic] = new_start + row_count;
        ur_space[i_logic] = new_space - row_count;
      }

      // Put into the next available space
      ur_space[i_logic]--;
      HighsInt i_put = ur_lastp[i_logic]++;
      ur_index[i_put] = cIndex;
      ur_value[i_put] = u_value[k];
    }

    // 4. Save pointers
    u_start.push_back(u_startX);
    u_last_p.push_back(u_endX);

    ur_start.push_back(ur_start[cLogic]);
    ur_lastp.push_back(ur_start[cLogic]);
    ur_space.push_back(ur_space[cLogic] + ur_lastp[cLogic] - ur_start[cLogic]);

    u_pivot_lookup[cIndex] = u_pivot_index.size();
    u_pivot_index[cLogic] = -1;
    u_pivot_index.push_back(cIndex);
    u_pivot_value.push_back(t_pivot[cp]);
  }

  //    // See if we want refactor
  //    if (u_total_x > u_merit_x && pf_pivot_index.size() > 100)
  //        *hint = 1;
  delete[] aq_work;
  delete[] ep_work;
  delete[] p_logic;
  delete[] p_value;
  delete[] p_alpha;
  delete[] t_start;
  delete[] t_pivot;
}